

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void biftyp(bifcxdef *ctx,int argc)

{
  long lVar1;
  undefined4 in_ESI;
  long in_RDI;
  runsdef val;
  undefined4 in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
  runpush((runcxdef *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),0,*(runsdef **)(lVar1 + -0x10));
  return;
}

Assistant:

void biftyp(bifcxdef *ctx, int argc)
{
    runsdef val;
    
    bifcntargs(ctx, 1, argc);
    
    /* get whatever it is, and push the type */
    runpop(ctx->bifcxrun, &val);
    val.runsv.runsvnum = val.runstyp;          /* new value is the datatype */
    runpush(ctx->bifcxrun, DAT_NUMBER, &val);
}